

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isLinearMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  CompareMode compareMode;
  bool isFixedPointDepth_00;
  bool bVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  int j;
  int j_00;
  TextureFormat *format;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vector<float,_2> local_130;
  Vector<float,_2> local_128;
  Vector<float,_2> local_120;
  Vector<float,_2> local_118;
  int local_110;
  int local_10c;
  int y1_1;
  int y0_1;
  int x1_1;
  int x0_1;
  Vec4 depths1;
  float maxB1;
  float minB1;
  float maxA1;
  float minA1;
  int i1;
  int j1;
  int y1;
  int y0;
  int x1;
  int x0;
  Vec4 depths0;
  float maxB0;
  float minB0;
  float maxA0;
  float minA0;
  int i0;
  int j0;
  int maxJ1;
  int minJ1;
  int maxJ0;
  int minJ0;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int h1;
  int h0;
  int w1;
  int w0;
  bool isFixedPointDepth;
  float result_local;
  float cmpReference_local;
  int coordZ_local;
  Vec2 *coord_local;
  TexComparePrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  format = ConstPixelBufferAccess::getFormat(level0);
  isFixedPointDepth_00 = isFixedPointDepthTextureFormat(format);
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  dim_01 = ConstPixelBufferAccess::getHeight(level0);
  dim_02 = ConstPixelBufferAccess::getHeight(level1);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,fVar9,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::x(coord);
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,(bool)(bVar1 & 1),dim_00,fVar9,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,(bool)(bVar1 & 1),dim_01,fVar9,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  fVar9 = Vector<float,_2>::y(coord);
  iVar2 = Vector<int,_3>::y(&prec->coordBits);
  iVar3 = Vector<int,_3>::y(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_02,fVar9,iVar2,iVar3);
  fVar9 = Vector<float,_2>::x(&uBounds1);
  fVar9 = (float)::deFloorFloatToInt32(fVar9 - 0.5);
  fVar10 = Vector<float,_2>::y(&uBounds1);
  dVar4 = ::deFloorFloatToInt32(fVar10 - 0.5);
  fVar10 = Vector<float,_2>::x(&vBounds0);
  fVar10 = (float)::deFloorFloatToInt32(fVar10 - 0.5);
  fVar11 = Vector<float,_2>::y(&vBounds0);
  dVar5 = ::deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::x(&vBounds1);
  minA0 = (float)::deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::y(&vBounds1);
  dVar6 = ::deFloorFloatToInt32(fVar11 - 0.5);
  fVar11 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar11 = (float)::deFloorFloatToInt32(fVar11 - 0.5);
  fVar12 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar7 = ::deFloorFloatToInt32(fVar12 - 0.5);
  do {
    maxA0 = fVar9;
    if (dVar6 < (int)minA0) {
      return false;
    }
    for (; (int)maxA0 <= dVar4; maxA0 = (float)((int)maxA0 + 1)) {
      fVar12 = Vector<float,_2>::x(&uBounds1);
      fVar12 = de::clamp<float>((fVar12 - 0.5) - (float)(int)maxA0,0.0,1.0);
      fVar13 = Vector<float,_2>::y(&uBounds1);
      fVar13 = de::clamp<float>((fVar13 - 0.5) - (float)(int)maxA0,0.0,1.0);
      fVar14 = Vector<float,_2>::x(&vBounds1);
      depths0.m_data[3] = de::clamp<float>((fVar14 - 0.5) - (float)(int)minA0,0.0,1.0);
      fVar14 = Vector<float,_2>::y(&vBounds1);
      depths0.m_data[2] = de::clamp<float>((fVar14 - 0.5) - (float)(int)minA0,0.0,1.0);
      Vector<float,_4>::Vector((Vector<float,_4> *)&x1);
      iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)maxA0,dim);
      iVar3 = TexVerifierUtil::wrap(sampler->wrapS,(int)maxA0 + 1,dim);
      j = TexVerifierUtil::wrap(sampler->wrapT,(int)minA0,dim_01);
      j_00 = TexVerifierUtil::wrap(sampler->wrapT,(int)minA0 + 1,dim_01);
      fVar14 = lookupDepth(level0,sampler,iVar2,j,coordZ);
      pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1,0);
      *pfVar8 = fVar14;
      fVar14 = lookupDepth(level0,sampler,iVar3,j,coordZ);
      pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1,1);
      *pfVar8 = fVar14;
      fVar14 = lookupDepth(level0,sampler,iVar2,j_00,coordZ);
      pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1,2);
      *pfVar8 = fVar14;
      fVar14 = lookupDepth(level0,sampler,iVar3,j_00,coordZ);
      pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1,3);
      *pfVar8 = fVar14;
      for (minA1 = fVar11; maxA1 = fVar10, (int)minA1 <= dVar7; minA1 = (float)((int)minA1 + 1)) {
        for (; (int)maxA1 <= dVar5; maxA1 = (float)((int)maxA1 + 1)) {
          fVar14 = Vector<float,_2>::x(&vBounds0);
          fVar14 = de::clamp<float>((fVar14 - 0.5) - (float)(int)maxA1,0.0,1.0);
          fVar15 = Vector<float,_2>::y(&vBounds0);
          fVar15 = de::clamp<float>((fVar15 - 0.5) - (float)(int)maxA1,0.0,1.0);
          fVar16 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
          depths1.m_data[3] = de::clamp<float>((fVar16 - 0.5) - (float)(int)minA1,0.0,1.0);
          fVar16 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
          depths1.m_data[2] = de::clamp<float>((fVar16 - 0.5) - (float)(int)minA1,0.0,1.0);
          Vector<float,_4>::Vector((Vector<float,_4> *)&x1_1);
          y0_1 = TexVerifierUtil::wrap(sampler->wrapS,(int)maxA1,dim_00);
          y1_1 = TexVerifierUtil::wrap(sampler->wrapS,(int)maxA1 + 1,dim_00);
          local_10c = TexVerifierUtil::wrap(sampler->wrapT,(int)minA1,dim_02);
          local_110 = TexVerifierUtil::wrap(sampler->wrapT,(int)minA1 + 1,dim_02);
          fVar16 = lookupDepth(level1,sampler,y0_1,local_10c,coordZ);
          pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1_1,0);
          *pfVar8 = fVar16;
          fVar16 = lookupDepth(level1,sampler,y1_1,local_10c,coordZ);
          pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1_1,1);
          *pfVar8 = fVar16;
          fVar16 = lookupDepth(level1,sampler,y0_1,local_110,coordZ);
          pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1_1,2);
          *pfVar8 = fVar16;
          fVar16 = lookupDepth(level1,sampler,y1_1,local_110,coordZ);
          pfVar8 = Vector<float,_4>::operator[]((Vector<float,_4> *)&x1_1,3);
          *pfVar8 = fVar16;
          compareMode = sampler->compare;
          Vector<float,_2>::Vector(&local_118,fVar12,fVar13);
          Vector<float,_2>::Vector(&local_120,depths0.m_data[3],depths0.m_data[2]);
          Vector<float,_2>::Vector(&local_128,fVar14,fVar15);
          Vector<float,_2>::Vector(&local_130,depths1.m_data[3],depths1.m_data[2]);
          bVar1 = isTrilinearCompareValid
                            (compareMode,prec,(Vec4 *)&x1,(Vec4 *)&x1_1,&local_118,&local_120,
                             &local_128,&local_130,fBounds,cmpReference,result,isFixedPointDepth_00)
          ;
          if (bVar1) {
            return true;
          }
        }
      }
    }
    minA0 = (float)((int)minA0 + 1);
  } while( true );
}

Assistant:

static bool isLinearMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const TexComparePrecision&		prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const float						cmpReference,
													const float						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int	minI1				= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y()-0.5f);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);
			Vec4		depths0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);

				depths0[0] = lookupDepth(level0, sampler, x0, y0, coordZ);
				depths0[1] = lookupDepth(level0, sampler, x1, y0, coordZ);
				depths0[2] = lookupDepth(level0, sampler, x0, y1, coordZ);
				depths0[3] = lookupDepth(level0, sampler, x1, y1, coordZ);
			}

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);
					Vec4		depths1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);

						depths1[0] = lookupDepth(level1, sampler, x0, y0, coordZ);
						depths1[1] = lookupDepth(level1, sampler, x1, y0, coordZ);
						depths1[2] = lookupDepth(level1, sampler, x0, y1, coordZ);
						depths1[3] = lookupDepth(level1, sampler, x1, y1, coordZ);
					}

					if (isTrilinearCompareValid(sampler.compare, prec, depths0, depths1,
												Vec2(minA0, maxA0), Vec2(minB0, maxB0),
												Vec2(minA1, maxA1), Vec2(minB1, maxB1),
												fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}